

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionBinder::QualifyColumnNames
          (ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *lambda_params,bool within_function_expression)

{
  ExpressionType EVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Alloc_hider _Var3;
  bool bVar4;
  pointer pPVar5;
  BaseExpression *pBVar6;
  ColumnRefExpression *pCVar7;
  PositionalReferenceExpression *ref;
  FunctionExpression *this_00;
  type expr_00;
  bool next_within_function_expression;
  string column_name;
  ErrorData error;
  string error_1;
  undefined1 local_f1;
  string local_f0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8 [2];
  char *local_a8;
  char local_98 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88 [56];
  string local_50;
  
  local_f1 = 0;
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar5->super_BaseExpression).type;
  if (EVar1 == FUNCTION) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    this_00 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar6);
    bVar4 = FunctionExpression::IsLambdaFunction(this_00);
    if (bVar4) {
      QualifyColumnNamesInLambda(this,this_00,lambda_params);
      return;
    }
    local_f1 = 1;
  }
  else if (EVar1 == POSITIONAL_REFERENCE) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    ref = BaseExpression::Cast<duckdb::PositionalReferenceExpression>(pBVar6);
    if ((ref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
      local_d0._8_8_ = (code **)0x0;
      local_c0 = (code *)((ulong)local_c0 & 0xffffffffffffff00);
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_d0._M_unused._M_object = &local_c0;
      BindContext::BindColumn
                (&local_50,&this->binder->bind_context,ref,(string *)&local_d0,&local_f0);
      if (local_50._M_string_length == 0) {
        ::std::__cxx11::string::_M_assign
                  ((string *)&(ref->super_ParsedExpression).super_BaseExpression.alias);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((code **)local_d0._M_unused._0_8_ != &local_c0) {
        operator_delete(local_d0._M_unused._M_object);
      }
    }
  }
  else if (EVar1 == COLUMN_REF) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    pCVar7 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar6);
    (*(pCVar7->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_d0,pCVar7);
    bVar4 = LambdaExpression::IsLambdaParameter(lambda_params,(string *)&local_d0);
    if ((code **)local_d0._M_unused._0_8_ != &local_c0) {
      operator_delete(local_d0._M_unused._M_object);
    }
    if (bVar4) {
      return;
    }
    ErrorData::ErrorData((ErrorData *)&local_d0);
    (*this->_vptr_ExpressionBinder[2])(&local_f0,this,pCVar7,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(expr);
      if ((pPVar5->super_BaseExpression).alias._M_string_length == 0) {
        if (within_function_expression) {
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_f0);
          (pPVar5->super_BaseExpression).alias._M_string_length = 0;
          *(pPVar5->super_BaseExpression).alias._M_dataplus._M_p = '\0';
        }
      }
      else {
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&local_f0);
        unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator->(expr);
        ::std::__cxx11::string::_M_assign((string *)&(pPVar5->super_BaseExpression).alias);
      }
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&local_f0);
      _Var3._M_p = local_f0._M_dataplus._M_p;
      (pPVar5->super_BaseExpression).query_location.index =
           (pCVar7->super_ParsedExpression).super_BaseExpression.query_location.index;
      local_f0._M_dataplus._M_p = (pointer)0x0;
      _Var2._M_head_impl =
           (expr->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)_Var3._M_p;
      if ((_Var2._M_head_impl != (ParsedExpression *)0x0) &&
         ((**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))(),
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_f0._M_dataplus._M_p !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_88);
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
    if ((code **)local_d0._8_8_ == local_b8) {
      return;
    }
    operator_delete((void *)local_d0._8_8_);
    return;
  }
  expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator*(expr);
  local_d0._8_8_ = 0;
  local_d0._M_unused._M_object = operator_new(0x18);
  *(vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
    **)local_d0._M_unused._0_8_ = lambda_params;
  *(undefined1 **)((long)local_d0._M_unused._0_8_ + 8) = &local_f1;
  *(ExpressionBinder **)((long)local_d0._M_unused._0_8_ + 0x10) = this;
  local_b8[0] = ::std::
                _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_columnref_expression.cpp:170:53)>
                ::_M_invoke;
  local_c0 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_columnref_expression.cpp:170:53)>
             ::_M_manager;
  ParsedExpressionIterator::EnumerateChildren
            (expr_00,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                      *)&local_d0);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,3);
  }
  return;
}

Assistant:

void ExpressionBinder::QualifyColumnNames(unique_ptr<ParsedExpression> &expr,
                                          vector<unordered_set<string>> &lambda_params,
                                          const bool within_function_expression) {

	bool next_within_function_expression = false;
	switch (expr->GetExpressionType()) {
	case ExpressionType::COLUMN_REF: {
		auto &col_ref = expr->Cast<ColumnRefExpression>();

		// don't qualify lambda parameters
		if (LambdaExpression::IsLambdaParameter(lambda_params, col_ref.GetName())) {
			return;
		}

		ErrorData error;
		auto new_expr = QualifyColumnName(col_ref, error);

		if (new_expr) {
			if (!expr->GetAlias().empty()) {
				// Pre-existing aliases are added to the qualified column reference
				new_expr->SetAlias(expr->GetAlias());
			} else if (within_function_expression) {
				// Qualifying the column reference may add an alias, but this needs to be removed within function
				// expressions, because the alias here means a named parameter instead of a positional parameter
				new_expr->ClearAlias();
			}

			// replace the expression with the qualified column reference
			new_expr->SetQueryLocation(col_ref.GetQueryLocation());
			expr = std::move(new_expr);
		}
		return;
	}
	case ExpressionType::POSITIONAL_REFERENCE: {
		auto &ref = expr->Cast<PositionalReferenceExpression>();
		if (ref.GetAlias().empty()) {
			string table_name, column_name;
			auto error = binder.bind_context.BindColumn(ref, table_name, column_name);
			if (error.empty()) {
				ref.SetAlias(column_name);
			}
		}
		break;
	}
	case ExpressionType::FUNCTION: {
		// Special-handling for lambdas, which are inside function expressions.
		auto &function = expr->Cast<FunctionExpression>();
		if (function.IsLambdaFunction()) {
			return QualifyColumnNamesInLambda(function, lambda_params);
		}

		next_within_function_expression = true;
		break;
	}
	default: // fall through
		break;
	}

	// recurse on the child expressions
	ParsedExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<ParsedExpression> &child) {
		QualifyColumnNames(child, lambda_params, next_within_function_expression);
	});
}